

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

StructNew * __thiscall
wasm::Builder::makeStructNew(Builder *this,HeapType type,initializer_list<wasm::Expression_*> args)

{
  StructNew *this_00;
  undefined1 local_38 [8];
  initializer_list<wasm::Expression_*> args_local;
  
  args_local._M_array = (iterator)args._M_len;
  local_38 = (undefined1  [8])args._M_array;
  this_00 = MixedArena::alloc<wasm::StructNew>(&this->wasm->allocator);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::initializer_list<wasm::Expression*>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&this_00->operands
             ,(initializer_list<wasm::Expression_*> *)local_38);
  wasm::Type::Type((Type *)&args_local._M_len,type,NonNullable,Inexact);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id =
       args_local._M_len;
  StructNew::finalize(this_00);
  return this_00;
}

Assistant:

StructNew* makeStructNew(HeapType type,
                           std::initializer_list<Expression*> args) {
    auto* ret = wasm.allocator.alloc<StructNew>();
    ret->operands.set(args);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }